

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void __thiscall DCanvas::DrawTextureParms(DCanvas *this,FTexture *img,DrawParms *parms)

{
  double dVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar9;
  ESPSResult EVar10;
  FDynamicColormap *pFVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int col;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  
  aVar9 = (anon_union_4_2_12391d7c_for_PalEntry_0)parms->colorOverlay;
  if ((uint)aVar9 < 0x1000000) {
    if (parms->remap == (FRemapTable *)0x0) {
      swrenderer::drawerargs::dc_colormap = (BYTE *)0x0;
    }
    else {
      swrenderer::drawerargs::dc_colormap = parms->remap->Remap;
    }
  }
  else {
    bVar4 = (parms->style).field_0.Flags;
    uVar12 = bVar4 & 0x20;
    uVar6 = uVar12 >> 5 ^ 1;
    if ((bVar4 & 0x10) == 0) {
      uVar6 = uVar12;
    }
    if (uVar6 != 0) {
      local_34 = aVar9;
      aVar9.field_0 =
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
           PalEntry::InverseColor((PalEntry *)&local_34.field_0);
      parms->colorOverlay = (uint32)aVar9;
    }
    pFVar11 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)(aVar9.d & 0xffffff),0);
    swrenderer::drawerargs::dc_colormap =
         pFVar11->Maps +
         (ulong)((ushort)((ushort)*(byte *)((long)&parms->colorOverlay + 3) << 5) / 0xff) * 0x100;
  }
  if (swrenderer::drawerargs::dc_colormap == (BYTE *)0x0) {
    swrenderer::drawerargs::dc_colormap = &swrenderer::identitymap;
  }
  swrenderer::fixedcolormap = swrenderer::drawerargs::dc_colormap;
  EVar10 = swrenderer::R_SetPatchStyle(parms->style,parms->Alpha,0,parms->fillcolor);
  uVar7 = swrenderer::drawerargs::dc_destorg;
  swrenderer::drawerargs::dc_destorg = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
  if (swrenderer::drawerargs::dc_destorg == (BYTE *)0x0) {
    I_FatalError("Attempt to write to buffer of hardware canvas");
  }
  uVar8 = swrenderer::CenterY;
  if (EVar10 != DontDraw) {
    dVar20 = parms->x;
    dVar16 = parms->left;
    dVar17 = parms->destwidth;
    dVar1 = parms->texwidth;
    swrenderer::CenterY = 0;
    modf(parms->y - (parms->top * parms->destheight) / parms->texheight,&swrenderer::sprtopscreen);
    dVar2 = parms->destheight;
    swrenderer::spryscale = dVar2 / (double)img->Height;
    if (swrenderer::spryscale <= 0.0) {
      __assert_fail("spryscale > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_draw.cpp"
                    ,0xcb,"virtual void DCanvas::DrawTextureParms(FTexture *, DrawParms &)");
    }
    swrenderer::sprflipvert = 0;
    swrenderer::drawerargs::dc_iscale = SUB84(1.0 / swrenderer::spryscale + 103079215104.0,0);
    swrenderer::dc_texturemid =
         (double)swrenderer::drawerargs::dc_iscale * (-1.0 - swrenderer::sprtopscreen) *
         1.52587890625e-05;
    uVar5 = img->Width;
    dVar3 = parms->destwidth;
    iVar13 = parms->dclip;
    if (iVar13 != DrawTextureParms::bottomclipper[0]) {
      uVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      for (lVar14 = 0; (ulong)uVar6 * 2 != lVar14; lVar14 = lVar14 + 2) {
        *(short *)((long)DrawTextureParms::bottomclipper + lVar14) = (short)iVar13;
      }
    }
    iVar15 = parms->uclip;
    if (iVar15 == 0) {
      swrenderer::mceilingclip = &swrenderer::zeroarray;
    }
    else if (iVar15 == DrawTextureParms::topclipper[0]) {
      swrenderer::mceilingclip = DrawTextureParms::topclipper;
    }
    else {
      uVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      swrenderer::mceilingclip = DrawTextureParms::topclipper;
      for (lVar14 = 0; (ulong)uVar6 * 2 != lVar14; lVar14 = lVar14 + 2) {
        *(short *)((long)DrawTextureParms::topclipper + lVar14) = (short)iVar15;
      }
    }
    dVar20 = dVar20 - (dVar16 * dVar17) / dVar1;
    dVar16 = (double)uVar5 / dVar3;
    swrenderer::mfloorclip = DrawTextureParms::bottomclipper;
    if (parms->flipX == 0) {
      col = 0;
    }
    else {
      col = *(int *)&img->Width * 0x10000 + -1;
      dVar16 = -dVar16;
    }
    dVar18 = dVar20 + dVar3;
    dVar17 = parms->texwidth;
    dVar1 = parms->windowleft;
    dVar19 = parms->windowright;
    if ((0.0 < dVar1) || (dVar19 < dVar17)) {
      if (dVar17 <= dVar19) {
        dVar19 = dVar17;
      }
      dVar20 = dVar20 + dVar1 * (dVar3 / dVar17);
      col = col + SUB84(dVar1 + 103079215104.0,0);
      dVar18 = dVar18 - (dVar17 - dVar19) * (dVar3 / dVar17);
    }
    dVar17 = (double)parms->lclip;
    if (dVar20 < dVar17) {
      col = col + SUB84((dVar17 - dVar20) * dVar16 + 103079215104.0,0);
      dVar20 = dVar17;
    }
    dVar17 = (double)parms->rclip;
    if (dVar18 <= (double)parms->rclip) {
      dVar17 = dVar18;
    }
    uVar12 = (uint)dVar17;
    swrenderer::drawerargs::dc_x = (uint)dVar20;
    uVar6 = uVar12 & 0xfffffffc;
    if (iVar13 - iVar15 < 0x20) {
      uVar6 = swrenderer::drawerargs::dc_x;
    }
    if (dVar2 < 32.0) {
      uVar6 = swrenderer::drawerargs::dc_x;
    }
    if (EVar10 == DoDraw0) {
      uVar6 = swrenderer::drawerargs::dc_x;
    }
    if ((int)swrenderer::drawerargs::dc_x < (int)uVar12) {
      for (; (iVar13 = SUB84(dVar16 + 103079215104.0,0),
             (int)swrenderer::drawerargs::dc_x < (int)uVar6 &&
             ((swrenderer::drawerargs::dc_x & 3) != 0));
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
        col = col + iVar13;
      }
      while ((int)swrenderer::drawerargs::dc_x < (int)uVar6) {
        swrenderer::rt_initcols((uint8_t *)0x0);
        for (iVar15 = -4; iVar15 != 0; iVar15 = iVar15 + 1) {
          swrenderer::R_DrawMaskedColumn(img,col,true,parms->masked == 0);
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1;
          col = col + iVar13;
        }
        swrenderer::rt_draw4cols(swrenderer::drawerargs::dc_x - 4);
      }
      for (; (int)swrenderer::drawerargs::dc_x < (int)uVar12;
          swrenderer::drawerargs::dc_x = swrenderer::drawerargs::dc_x + 1) {
        swrenderer::R_DrawMaskedColumn(img,col,false,parms->masked == 0);
        col = col + iVar13;
      }
    }
  }
  swrenderer::CenterY = uVar8;
  swrenderer::R_FinishSetPatchStyle();
  swrenderer::drawerargs::dc_destorg = (BYTE *)uVar7;
  if ((ticdup != 0) && (menuactive == MENU_Off)) {
    NetUpdate();
  }
  return;
}

Assistant:

void DCanvas::DrawTextureParms(FTexture *img, DrawParms &parms)
{
#ifndef NO_SWRENDER
	using namespace swrenderer;
	using namespace drawerargs;

	static short bottomclipper[MAXWIDTH], topclipper[MAXWIDTH];
	const BYTE *translation = NULL;

	if (APART(parms.colorOverlay) != 0)
	{
		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertoverlay = (parms.style.Flags & STYLEF_InvertOverlay);

		if (parms.style.Flags & STYLEF_InvertSource)
		{
			invertoverlay = !invertoverlay;
		}
		if (invertoverlay)
		{
			parms.colorOverlay = PalEntry(parms.colorOverlay).InverseColor();
		}
		// Note that this overrides DTA_Translation in software, but not in hardware.
		FDynamicColormap *colormap = GetSpecialLights(MAKERGB(255,255,255),
			parms.colorOverlay & MAKEARGB(0,255,255,255), 0);
		translation = &colormap->Maps[(APART(parms.colorOverlay)*NUMCOLORMAPS/255)*256];
	}
	else if (parms.remap != NULL)
	{
		translation = parms.remap->Remap;
	}

	if (translation != NULL)
	{
		dc_colormap = (lighttable_t *)translation;
	}
	else
	{
		dc_colormap = identitymap;
	}

	fixedcolormap = dc_colormap;
	ESPSResult mode = R_SetPatchStyle (parms.style, parms.Alpha, 0, parms.fillcolor);

	BYTE *destorgsave = dc_destorg;
	dc_destorg = screen->GetBuffer();
	if (dc_destorg == NULL)
	{
		I_FatalError("Attempt to write to buffer of hardware canvas");
	}

	double x0 = parms.x - parms.left * parms.destwidth / parms.texwidth;
	double y0 = parms.y - parms.top * parms.destheight / parms.texheight;

	if (mode != DontDraw)
	{
		int stop4;

		double centeryback = CenterY;
		CenterY = 0;

		// There is not enough precision in the drawing routines to keep the full
		// precision for y0. :(
		modf(y0, &sprtopscreen);

		double yscale = parms.destheight / img->GetHeight();
		double iyscale = 1 / yscale;

		spryscale = yscale;
		assert(spryscale > 0);

		sprflipvert = false;
		//dc_iscale = FLOAT2FIXED(iyscale);
		//dc_texturemid = (-y0) * iyscale;
		//dc_iscale = 0xffffffffu / (unsigned)spryscale;
		dc_iscale = FLOAT2FIXED(1 / spryscale);
		dc_texturemid = (CenterY - 1 - sprtopscreen) * dc_iscale / 65536;
		fixed_t frac = 0;
		double xiscale = img->GetWidth() / parms.destwidth;
		double x2 = x0 + parms.destwidth;

		if (bottomclipper[0] != parms.dclip)
		{
			fillshort(bottomclipper, screen->GetWidth(), (short)parms.dclip);
		}
		if (parms.uclip != 0)
		{
			if (topclipper[0] != parms.uclip)
			{
				fillshort(topclipper, screen->GetWidth(), (short)parms.uclip);
			}
			mceilingclip = topclipper;
		}
		else
		{
			mceilingclip = zeroarray;
		}
		mfloorclip = bottomclipper;

		if (parms.flipX)
		{
			frac = (img->GetWidth() << FRACBITS) - 1;
			xiscale = -xiscale;
		}

		if (parms.windowleft > 0 || parms.windowright < parms.texwidth)
		{
			double wi = MIN(parms.windowright, parms.texwidth);
			double xscale = parms.destwidth / parms.texwidth;
			x0 += parms.windowleft * xscale;
			frac += FLOAT2FIXED(parms.windowleft);
			x2 -= (parms.texwidth - wi) * xscale;
		}
		if (x0 < parms.lclip)
		{
			frac += FLOAT2FIXED((parms.lclip - x0) * xiscale);
			x0 = parms.lclip;
		}
		if (x2 > parms.rclip)
		{
			x2 = parms.rclip;
		}

		// Drawing short output ought to fit in the data cache well enough
		// if we draw one column at a time, so do that, since it's simpler.
		if (parms.destheight < 32 || (parms.dclip - parms.uclip) < 32)
		{
			mode = DoDraw0;
		}

		dc_x = int(x0);
		int x2_i = int(x2);
		fixed_t xiscale_i = FLOAT2FIXED(xiscale);

		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = dc_x;
		}
		else	 // DoDraw1`
		{
			// Up to four columns at a time
			stop4 = x2_i & ~3;
		}

		if (dc_x < x2_i)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					R_DrawMaskedColumn(img, frac, true, !parms.masked);
					dc_x++;
					frac += xiscale_i;
				}
				rt_draw4cols(dc_x - 4);
			}

			while (dc_x < x2_i)
			{
				R_DrawMaskedColumn(img, frac, false, !parms.masked);
				dc_x++;
				frac += xiscale_i;
			}
		}
		CenterY = centeryback;
	}
	R_FinishSetPatchStyle ();

	dc_destorg = destorgsave;

	if (ticdup != 0 && menuactive == MENU_Off)
	{
		NetUpdate();
	}
#endif
}